

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void SetShapesTexture(Texture2D texture,Rectangle source)

{
  if (((texture.id != 0) && ((source.width != 0.0 || (NAN(source.width))))) &&
     ((source.height != 0.0 || (NAN(source.height))))) {
    texShapes.format = texture.format;
    texShapes.id = (uint)texture._0_8_;
    texShapes.width = SUB84(texture._0_8_,4);
    texShapes.height = texture.height;
    texShapes.mipmaps = texture.mipmaps;
    texShapesRec = source;
    return;
  }
  texShapes.id = 1;
  texShapes.width = 1;
  texShapes.height = 1;
  texShapes.mipmaps = 1;
  texShapes.format = 7;
  texShapesRec = _DAT_001c94a0;
  return;
}

Assistant:

void SetShapesTexture(Texture2D texture, Rectangle source)
{
    // Reset texture to default pixel if required
    // WARNING: Shapes texture should be probably better validated,
    // it can break the rendering of all shapes if misused
    if ((texture.id == 0) || (source.width == 0) || (source.height == 0))
    {
        texShapes = (Texture2D){ 1, 1, 1, 1, 7 };
        texShapesRec = (Rectangle){ 0.0f, 0.0f, 1.0f, 1.0f };
    }
    else
    {
        texShapes = texture;
        texShapesRec = source;
    }
}